

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<int,std::__cxx11::string,int,unsigned_int>
               (ostream *out,char *fmt,int *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,int *args_2
               ,uint *args_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff38;
  int local_78 [28];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<int,std::__cxx11::string,int,unsigned_int>
            (local_78,in_RSI,in_RDI,(uint *)in_stack_ffffffffffffff38);
  vformat((ostream *)in_RSI,(char *)in_RDI,in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}